

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_level.cpp
# Opt level: O1

void G_WriteSnapshots(FILE *file)

{
  FPNGChunkArchive *this;
  long lVar1;
  ulong uVar2;
  undefined8 *puVar3;
  SBYTE cnum;
  FPNGChunkArchive arc3;
  BYTE local_329;
  FPNGChunkArchive local_328;
  
  if (wadlevelinfos.Count != 0) {
    lVar1 = 0;
    uVar2 = 0;
    do {
      if (*(long *)((long)&(wadlevelinfos.Array)->snapshot + lVar1) != 0) {
        FPNGChunkArchive::FPNGChunkArchive(&local_328,file,0x70416e73);
        writeSnapShot(&local_328.super_FArchive,
                      (level_info_t *)((long)&(wadlevelinfos.Array)->levelnum + lVar1));
        FPNGChunkArchive::~FPNGChunkArchive(&local_328);
      }
      uVar2 = uVar2 + 1;
      lVar1 = lVar1 + 0x1b0;
    } while (uVar2 < wadlevelinfos.Count);
  }
  if (TheDefaultLevelInfo.snapshot != (FCompressedMemFile *)0x0) {
    FPNGChunkArchive::FPNGChunkArchive(&local_328,file,0x704e7364);
    writeSnapShot(&local_328.super_FArchive,&TheDefaultLevelInfo);
    FPNGChunkArchive::~FPNGChunkArchive(&local_328);
  }
  if (wadlevelinfos.Count == 0) {
    this = (FPNGChunkArchive *)0x0;
  }
  else {
    lVar1 = 100;
    uVar2 = 0;
    this = (FPNGChunkArchive *)0x0;
    do {
      if (*(int *)((long)&(wadlevelinfos.Array)->levelnum + lVar1) < 0) {
        if (this == (FPNGChunkArchive *)0x0) {
          this = (FPNGChunkArchive *)operator_new(0x300);
          FPNGChunkArchive::FPNGChunkArchive(this,file,0x74536976);
        }
        FArchive::operator<<
                  (&this->super_FArchive,(FString *)((long)wadlevelinfos.Array + lVar1 + -0x5c));
      }
      uVar2 = uVar2 + 1;
      lVar1 = lVar1 + 0x1b0;
    } while (uVar2 < wadlevelinfos.Count);
  }
  if (this != (FPNGChunkArchive *)0x0) {
    FString::FString((FString *)&local_328,(char *)"");
    FArchive::operator<<(&this->super_FArchive,(FString *)&local_328);
    (*(this->super_FArchive)._vptr_FArchive[1])(this);
    FString::~FString((FString *)&local_328);
  }
  if (multiplayer == true) {
    FPNGChunkArchive::FPNGChunkArchive(&local_328,file,0x734c6372);
    lVar1 = 0;
    do {
      local_329 = (BYTE)SinglePlayerClass[lVar1];
      FArchive::operator<<(&local_328.super_FArchive,&local_329);
      lVar1 = lVar1 + 1;
    } while (lVar1 != 8);
    FPNGChunkArchive::~FPNGChunkArchive(&local_328);
  }
  FPNGChunkArchive::FPNGChunkArchive(&local_328,file,0x734c6370);
  puVar3 = &DAT_00a392e0;
  lVar1 = 0;
  do {
    if (playeringame[lVar1] == true) {
      local_329 = (BYTE)lVar1;
      FArchive::operator<<(&local_328.super_FArchive,&local_329);
      FArchive::UserWriteClass(&local_328.super_FArchive,(PClass *)*puVar3);
    }
    local_329 = 0xff;
    FArchive::operator<<(&local_328.super_FArchive,&local_329);
    lVar1 = lVar1 + 1;
    puVar3 = puVar3 + 0x54;
  } while (lVar1 != 8);
  FPNGChunkArchive::~FPNGChunkArchive(&local_328);
  return;
}

Assistant:

void G_WriteSnapshots (FILE *file)
{
	unsigned int i;

	for (i = 0; i < wadlevelinfos.Size(); i++)
	{
		if (wadlevelinfos[i].snapshot)
		{
			FPNGChunkArchive arc (file, SNAP_ID);
			writeSnapShot (arc, (level_info_t *)&wadlevelinfos[i]);
		}
	}
	if (TheDefaultLevelInfo.snapshot != NULL)
	{
		FPNGChunkArchive arc (file, DSNP_ID);
		writeSnapShot(arc, &TheDefaultLevelInfo);
	}

	FPNGChunkArchive *arc = NULL;
	
	// Write out which levels have been visited
	for (i = 0; i < wadlevelinfos.Size(); ++i)
	{
		if (wadlevelinfos[i].flags & LEVEL_VISITED)
		{
			if (arc == NULL)
			{
				arc = new FPNGChunkArchive (file, VIST_ID);
			}
			(*arc) << wadlevelinfos[i].MapName;
		}
	}

	if (arc != NULL)
	{
		FString empty = "";
		(*arc) << empty;
		delete arc;
	}

	// Store player classes to be used when spawning a random class
	if (multiplayer)
	{
		FPNGChunkArchive arc2 (file, RCLS_ID);
		for (i = 0; i < MAXPLAYERS; ++i)
		{
			SBYTE cnum = SinglePlayerClass[i];
			arc2 << cnum;
		}
	}

	// Store player classes that are currently in use
	FPNGChunkArchive arc3 (file, PCLS_ID);
	for (i = 0; i < MAXPLAYERS; ++i)
	{
		BYTE pnum;
		if (playeringame[i])
		{
			pnum = i;
			arc3 << pnum;
			arc3.UserWriteClass (players[i].cls);
		}
		pnum = 255;
		arc3 << pnum;
	}
}